

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

void __thiscall CodeGen::generate(CodeGen *this,ValidSchema *schema)

{
  __normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
  *this_00;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  CodeGen *this_01;
  NodePtr *n;
  string *name;
  pointer pPVar4;
  ValidSchema *in_RSI;
  undefined8 *in_RDI;
  const_iterator it_1;
  const_iterator it;
  NodePtr *root;
  string h;
  string *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  string *in_stack_fffffffffffffe98;
  CodeGen *in_stack_fffffffffffffea0;
  CodeGen *in_stack_ffffffffffffff48;
  undefined1 local_88 [32];
  string local_68 [24];
  size_t in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  
  emitCopyright((CodeGen *)0x1bd84c);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,(string *)(in_RDI + 0x14));
  }
  else {
    guard_abi_cxx11_(in_stack_ffffffffffffff48);
  }
  poVar3 = std::operator<<((ostream *)in_RDI[1],"#ifndef ");
  poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffffd0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)in_RDI[1],"#define ");
  poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffffd0);
  std::operator<<(poVar3,"\n\n\n");
  poVar3 = std::operator<<((ostream *)in_RDI[1],"#include <sstream>\n");
  poVar3 = std::operator<<(poVar3,"#include \"boost/any.hpp\"\n");
  poVar3 = std::operator<<(poVar3,"#include \"");
  poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0xf));
  poVar3 = std::operator<<(poVar3,"Specific.hh\"\n");
  poVar3 = std::operator<<(poVar3,"#include \"");
  poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0xf));
  poVar3 = std::operator<<(poVar3,"Encoder.hh\"\n");
  this_01 = (CodeGen *)std::operator<<(poVar3,"#include \"");
  n = (NodePtr *)std::operator<<((ostream *)this_01,(string *)(in_RDI + 0xf));
  poVar3 = std::operator<<((ostream *)n,"Decoder.hh\"\n");
  std::operator<<(poVar3,"\n");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)in_RDI[1],"namespace ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 3));
    std::operator<<(poVar3," {\n");
    *(undefined1 *)(in_RDI + 2) = 1;
  }
  name = (string *)avro::ValidSchema::root(in_RSI);
  generateType_abi_cxx11_(this_01,n);
  std::__cxx11::string::~string(local_68);
  local_88._16_8_ =
       std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>::begin
                 ((vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_> *)
                  in_stack_fffffffffffffe88);
  __gnu_cxx::
  __normal_iterator<PendingSetterGetter_const*,std::vector<PendingSetterGetter,std::allocator<PendingSetterGetter>>>
  ::__normal_iterator<PendingSetterGetter*>
            ((__normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
              *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (__normal_iterator<PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
              *)in_stack_fffffffffffffe88);
  while( true ) {
    local_88._8_8_ =
         std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>::end
                   ((vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_> *)
                    in_stack_fffffffffffffe88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (__normal_iterator<PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    this_00 = (__normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
               *)(local_88 + 0x18);
    __gnu_cxx::
    __normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
    ::operator->(this_00);
    __gnu_cxx::
    __normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
    ::operator->(this_00);
    __gnu_cxx::
    __normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
    ::operator->(this_00);
    __gnu_cxx::
    __normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
    ::operator->(this_00);
    generateGetterAndSetter
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,name,
               in_stack_ffffffffffffffb0);
    __gnu_cxx::
    __normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
    ::operator++((__normal_iterator<const_PendingSetterGetter_*,_std::vector<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>_>
                  *)(local_88 + 0x18));
  }
  std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>::begin
            ((vector<PendingConstructor,_std::allocator<PendingConstructor>_> *)
             in_stack_fffffffffffffe88);
  __gnu_cxx::
  __normal_iterator<PendingConstructor_const*,std::vector<PendingConstructor,std::allocator<PendingConstructor>>>
  ::__normal_iterator<PendingConstructor*>
            ((__normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
              *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (__normal_iterator<PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
              *)in_stack_fffffffffffffe88);
  while( true ) {
    std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>::end
              ((vector<PendingConstructor,_std::allocator<PendingConstructor>_> *)
               in_stack_fffffffffffffe88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (__normal_iterator<PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    in_stack_fffffffffffffe98 = (string *)in_RDI[1];
    in_stack_fffffffffffffe88 = (string *)local_88;
    in_stack_fffffffffffffea0 =
         (CodeGen *)
         __gnu_cxx::
         __normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
         ::operator->((__normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
                       *)in_stack_fffffffffffffe88);
    pPVar4 = __gnu_cxx::
             __normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
             ::operator->((__normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
                           *)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe94 = (uint)pPVar4->initMember;
    __gnu_cxx::
    __normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
    ::operator->((__normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
                  *)in_stack_fffffffffffffe88);
    generateConstructor((ostream *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        SUB41(in_stack_fffffffffffffe94 >> 0x18,0),in_stack_fffffffffffffe88);
    __gnu_cxx::
    __normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
    ::operator++((__normal_iterator<const_PendingConstructor_*,_std::vector<PendingConstructor,_std::allocator<PendingConstructor>_>_>
                  *)local_88);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    *(undefined1 *)(in_RDI + 2) = 0;
    std::operator<<((ostream *)in_RDI[1],"}\n");
  }
  std::operator<<((ostream *)in_RDI[1],"namespace avro {\n");
  *in_RDI = 0;
  generateTraits(in_stack_fffffffffffffea0,(NodePtr *)in_stack_fffffffffffffe98);
  std::operator<<((ostream *)in_RDI[1],"}\n");
  std::operator<<((ostream *)in_RDI[1],"#endif\n");
  std::ostream::flush();
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void CodeGen::generate(const ValidSchema& schema)
{
    emitCopyright();

    string h = guardString_.empty() ? guard() : guardString_;

    os_ << "#ifndef " << h << "\n";
    os_ << "#define " << h << "\n\n\n";

    os_ << "#include <sstream>\n"
        << "#include \"boost/any.hpp\"\n"
        << "#include \"" << includePrefix_ << "Specific.hh\"\n"
        << "#include \"" << includePrefix_ << "Encoder.hh\"\n"
        << "#include \"" << includePrefix_ << "Decoder.hh\"\n"
        << "\n";

    if (! ns_.empty()) {
        os_ << "namespace " << ns_ << " {\n";
        inNamespace_ = true;
    }

    const NodePtr& root = schema.root();
    generateType(root);

    for (vector<PendingSetterGetter>::const_iterator it =
        pendingGettersAndSetters.begin();
        it != pendingGettersAndSetters.end(); ++it) {
        generateGetterAndSetter(os_, it->structName, it->type, it->name,
            it->idx);
    }

    for (vector<PendingConstructor>::const_iterator it =
        pendingConstructors.begin();
        it != pendingConstructors.end(); ++it) {
        generateConstructor(os_, it->structName,
            it->initMember, it->memberName);
    }

    if (! ns_.empty()) {
        inNamespace_ = false;
        os_ << "}\n";
    }

    os_ << "namespace avro {\n";

    unionNumber_ = 0;

    generateTraits(root);

    os_ << "}\n";

    os_ << "#endif\n";
    os_.flush();

}